

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::ReferenceContext::deleteVertexArray(ReferenceContext *this,VertexArray *vertexArray)

{
  pointer pVVar1;
  DataBuffer *object;
  long lVar2;
  size_t ndx;
  ulong uVar3;
  
  if (this->m_vertexArrayBinding == vertexArray) {
    (*(this->super_Context)._vptr_Context[0x4b])(this,0);
  }
  if (vertexArray->m_elementArrayBufferBinding != (DataBuffer *)0x0) {
    rc::ObjectManager<sglr::rc::DataBuffer>::releaseReference
              (&this->m_buffers,vertexArray->m_elementArrayBufferBinding);
  }
  lVar2 = 0x20;
  for (uVar3 = 0;
      pVVar1 = (vertexArray->m_arrays).
               super__Vector_base<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)(((long)(vertexArray->m_arrays).
                             super__Vector_base<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1) / 0x30);
      uVar3 = uVar3 + 1) {
    object = *(DataBuffer **)(&pVVar1->enabled + lVar2);
    if (object != (DataBuffer *)0x0) {
      rc::ObjectManager<sglr::rc::DataBuffer>::releaseReference(&this->m_buffers,object);
    }
    lVar2 = lVar2 + 0x30;
  }
  rc::ObjectManager<sglr::rc::VertexArray>::releaseReference(&this->m_vertexArrays,vertexArray);
  return;
}

Assistant:

void ReferenceContext::deleteVertexArray (rc::VertexArray* vertexArray)
{
	if (m_vertexArrayBinding == vertexArray)
		bindVertexArray(0);

	if (vertexArray->m_elementArrayBufferBinding)
		m_buffers.releaseReference(vertexArray->m_elementArrayBufferBinding);

	for (size_t ndx = 0; ndx < vertexArray->m_arrays.size(); ++ndx)
		if (vertexArray->m_arrays[ndx].bufferBinding)
			m_buffers.releaseReference(vertexArray->m_arrays[ndx].bufferBinding);

	DE_ASSERT(vertexArray->getRefCount() == 1);
	m_vertexArrays.releaseReference(vertexArray);
}